

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_urbg.cc
# Opt level: O0

uint64_t __thiscall
absl::lts_20240722::random_internal::anon_unknown_0::RandenPoolEntry::Generate<unsigned_long>
          (RandenPoolEntry *this)

{
  size_t sVar1;
  uint64_t uVar2;
  uint64_t result;
  uint32_t *p;
  SpinLockHolder local_18;
  SpinLockHolder l;
  RandenPoolEntry *this_local;
  
  l.lock_ = (SpinLock *)this;
  base_internal::SpinLockHolder::SpinLockHolder(&local_18,&this->mu_);
  if (0x3e < this->next_) {
    this->next_ = 4;
    Randen::Generate(&this->impl_,this);
  }
  sVar1 = this->next_;
  this->next_ = this->next_ + 2;
  uVar2 = *(uint64_t *)(this->state_ + sVar1);
  base_internal::SpinLockHolder::~SpinLockHolder(&local_18);
  return uVar2;
}

Assistant:

inline uint64_t RandenPoolEntry::Generate<uint64_t>() {
  SpinLockHolder l(&mu_);
  if (next_ >= kState - 1) {
    next_ = kCapacity;
    impl_.Generate(state_);
  }
  auto p = state_ + next_;
  next_ += 2;

  uint64_t result;
  std::memcpy(&result, p, sizeof(result));
  return result;
}